

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::SelectionSet::size
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,SelectionSet *this)

{
  pointer piVar1;
  uint *puVar2;
  long lVar3;
  allocator_type local_11;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,6,&local_11);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (uint *)((long)&(((this->bitsets_).
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_> + 0x18);
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    piVar1[lVar3] =
         (*(int *)&((_Bit_iterator_base *)(puVar2 + -2))->_M_p - puVar2[-6]) * 8 + *puVar2;
    puVar2 = puVar2 + 10;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> SelectionSet::size() const {
    std::vector<int> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].size();
    return result;
  }